

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::ModeFunction<duckdb::ModeStandard<unsigned_short>>::
     Finalize<unsigned_short,duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>>
               (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *state,
               unsigned_short *target,AggregateFinalizeData *finalize_data)

{
  Vector *result;
  bool bVar1;
  unsigned_short uVar2;
  pointer pvVar3;
  undefined8 *in_RDX;
  unsigned_short *in_RSI;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_RDI;
  AggregateFinalizeData *in_stack_00000010;
  const_iterator highest_frequency;
  unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_20;
  undefined8 *local_18;
  unsigned_short *local_10;
  
  if (in_RDI->frequency_map == (Counts *)0x0) {
    AggregateFinalizeData::ReturnNull(in_stack_00000010);
  }
  else {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_20._M_cur =
         (__node_type *)
         ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::Scan(in_RDI);
    local_28._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = ::std::__detail::operator!=(&local_20,&local_28);
    if (bVar1) {
      result = (Vector *)*local_18;
      pvVar3 = ::std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                             *)0x1df74c9);
      uVar2 = ModeStandard<unsigned_short>::Assign<unsigned_short,unsigned_short>
                        (result,pvVar3->first);
      *local_10 = uVar2;
    }
    else {
      AggregateFinalizeData::ReturnNull(in_stack_00000010);
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}